

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
::fastAccessDx(value_type *__return_storage_ptr__,
              FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
              *this,int i)

{
  value_type local_50;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> local_30;
  
  FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
  ::fastAccessDx(&local_50,&this->left_->fadexpr_,i);
  local_30.fadexpr_.right_ = (this->right_->dx_).ptr_to_data + i;
  local_30.fadexpr_.left_ = &local_50;
  Fad<double>::Fad<FadBinaryAdd<Fad<double>,Fad<double>>>(__return_storage_ptr__,&local_30);
  Fad<double>::~Fad(&local_50);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}